

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.hpp
# Opt level: O2

void __thiscall
Args::Arg::checkCorrectnessBeforeParsing(Arg *this,StringList *flags,StringList *names)

{
  String *__rhs;
  size_type sVar1;
  pointer pcVar2;
  StringList *this_00;
  int iVar3;
  long lVar4;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  BaseException *pBVar6;
  size_type sVar7;
  type *__range2;
  bool bVar8;
  allocator local_139;
  String flag;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  StringList *local_d8;
  String local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  sVar1 = (this->m_flag)._M_string_length;
  if (sVar1 == 0) {
LAB_00103ba0:
    if ((this->m_name)._M_string_length == 0) {
      bVar8 = true;
    }
    else {
      local_d8 = names;
      if (details::isCorrectName(std::__cxx11::string_const&)::availableSymbols_abi_cxx11_ == '\0')
      {
        iVar3 = __cxa_guard_acquire(&details::isCorrectName(std::__cxx11::string_const&)::
                                     availableSymbols_abi_cxx11_);
        if (iVar3 != 0) {
          std::__cxx11::string::string
                    ((string *)
                     details::isCorrectName(std::__cxx11::string_const&)::
                     availableSymbols_abi_cxx11_,
                     "0123456789abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ-_",
                     (allocator *)&flag);
          __cxa_atexit(std::__cxx11::string::~string,
                       details::isCorrectName(std::__cxx11::string_const&)::
                       availableSymbols_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&details::isCorrectName(std::__cxx11::string_const&)::
                               availableSymbols_abi_cxx11_);
        }
      }
      pcVar2 = (this->m_name)._M_dataplus._M_p;
      sVar1 = (this->m_name)._M_string_length;
      sVar7 = 0;
      while (sVar1 != sVar7) {
        lVar4 = std::__cxx11::string::find(-0x58,(ulong)(uint)(int)pcVar2[sVar7]);
        sVar7 = sVar7 + 1;
        if (lVar4 == -1) {
          pBVar6 = (BaseException *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&local_118,"Disallowed name \"--",(allocator *)&local_f8);
          std::operator+(&flag,&local_118,&this->m_name);
          std::operator+(&local_b0,&flag,"\".");
          BaseException::BaseException(pBVar6,&local_b0);
          __cxa_throw(pBVar6,&BaseException::typeinfo,BaseException::~BaseException);
        }
      }
      std::__cxx11::string::string((string *)&local_118,"--",(allocator *)&local_f8);
      std::operator+(&flag,&local_118,&this->m_name);
      this_00 = local_d8;
      std::__cxx11::string::~string((string *)&local_118);
      _Var5 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        ((this_00->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start,
                         (this_00->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish,&flag);
      if (_Var5._M_current !=
          (this_00->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        pBVar6 = (BaseException *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&local_f8,"Redefinition of argument with name \"",&local_139);
        std::operator+(&local_118,&local_f8,&flag);
        std::operator+(&local_90,&local_118,"\".");
        BaseException::BaseException(pBVar6,&local_90);
        __cxa_throw(pBVar6,&BaseException::typeinfo,BaseException::~BaseException);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this_00,&flag);
      std::__cxx11::string::~string((string *)&flag);
      bVar8 = (this->m_name)._M_string_length == 0;
    }
    if (((this->m_flag)._M_string_length == 0) && (bVar8)) {
      pBVar6 = (BaseException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_d0,"Arguments with empty flag and name are disallowed.",
                 (allocator *)&flag);
      BaseException::BaseException(pBVar6,&local_d0);
      __cxa_throw(pBVar6,&BaseException::typeinfo,BaseException::~BaseException);
    }
    return;
  }
  __rhs = &this->m_flag;
  if (sVar1 == 1) {
    if (details::isCorrectFlag(std::__cxx11::string_const&)::availableSymbols_abi_cxx11_ == '\0') {
      iVar3 = __cxa_guard_acquire(&details::isCorrectFlag(std::__cxx11::string_const&)::
                                   availableSymbols_abi_cxx11_);
      if (iVar3 != 0) {
        std::__cxx11::string::string
                  ((string *)
                   details::isCorrectFlag(std::__cxx11::string_const&)::availableSymbols_abi_cxx11_,
                   "0123456789abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ",
                   (allocator *)&flag);
        __cxa_atexit(std::__cxx11::string::~string,
                     details::isCorrectFlag(std::__cxx11::string_const&)::
                     availableSymbols_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&details::isCorrectFlag(std::__cxx11::string_const&)::
                             availableSymbols_abi_cxx11_);
      }
    }
    lVar4 = std::__cxx11::string::find
                      ((string *)
                       details::isCorrectFlag(std::__cxx11::string_const&)::
                       availableSymbols_abi_cxx11_,(ulong)__rhs);
    if (lVar4 != -1) {
      std::__cxx11::string::string((string *)&local_118,"-",(allocator *)&local_f8);
      std::operator+(&flag,&local_118,__rhs);
      std::__cxx11::string::~string((string *)&local_118);
      _Var5 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        ((flags->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start,
                         (flags->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish,&flag);
      if (_Var5._M_current !=
          (flags->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        pBVar6 = (BaseException *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&local_f8,"Redefinition of argument with flag \"",&local_139);
        std::operator+(&local_118,&local_f8,&flag);
        std::operator+(&local_50,&local_118,"\".");
        BaseException::BaseException(pBVar6,&local_50);
        __cxa_throw(pBVar6,&BaseException::typeinfo,BaseException::~BaseException);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(flags,&flag);
      std::__cxx11::string::~string((string *)&flag);
      goto LAB_00103ba0;
    }
  }
  pBVar6 = (BaseException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&local_118,"Disallowed flag \"-",(allocator *)&local_f8);
  std::operator+(&flag,&local_118,__rhs);
  std::operator+(&local_70,&flag,"\".");
  BaseException::BaseException(pBVar6,&local_70);
  __cxa_throw(pBVar6,&BaseException::typeinfo,BaseException::~BaseException);
}

Assistant:

inline void
Arg::checkCorrectnessBeforeParsing( StringList & flags,
	StringList & names ) const
{
	if( !m_flag.empty() )
	{
		if( details::isCorrectFlag( m_flag ) )
		{
			const String flag = String( SL( "-" ) ) + m_flag;

			auto it = std::find( flags.begin(), flags.end(), flag );

			if( it != flags.end() )
				throw BaseException( String( SL( "Redefinition of argument "
					"with flag \"" ) ) + flag + SL( "\"." ) );
			else
				flags.push_back( flag );
		}
		else
			throw BaseException( String( SL( "Disallowed flag \"-" ) ) +
				m_flag + SL( "\"." ) );
	}

	if( !m_name.empty() )
	{
		if( details::isCorrectName( m_name ) )
		{
			const String name = String( SL( "--" ) ) + m_name;

			auto it = std::find( names.begin(), names.end(), name );

			if( it != names.end() )
				throw BaseException( String( SL( "Redefinition of argument "
					"with name \"" ) ) + name + SL( "\"." ) );
			else
				names.push_back( name );
		}
		else
			throw BaseException( String( SL( "Disallowed name \"--" ) ) +
				m_name + SL( "\"." ) );
	}

	if( m_flag.empty() && m_name.empty() )
		throw BaseException( String( SL( "Arguments with empty flag and name "
			"are disallowed." ) ) );
}